

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O2

void __thiscall nv::ColorBlock::diameterRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  anon_union_4_2_12391d8d_for_Color32_0 aVar1;
  anon_union_4_2_12391d8d_for_Color32_0 aVar2;
  long lVar3;
  long lVar4;
  int j;
  long lVar5;
  anon_union_4_2_12391d8d_for_Color32_0 in_R9D;
  anon_union_4_2_12391d8d_for_Color32_0 in_R10D;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  lVar4 = 1;
  uVar6 = 0;
  for (lVar3 = 0; lVar5 = lVar4, lVar3 != 0x10; lVar3 = lVar3 + 1) {
    for (; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      aVar1 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[lVar3].field_0.u;
      aVar2 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[lVar5].field_0.u;
      iVar7 = (aVar1.u >> 0x10 & 0xff) - (aVar2.u >> 0x10 & 0xff);
      iVar8 = (aVar1.u >> 8 & 0xff) - (aVar2.u >> 8 & 0xff);
      iVar9 = (aVar1.u & 0xff) - (aVar2.u & 0xff);
      uVar10 = iVar9 * iVar9 + iVar7 * iVar7 + iVar8 * iVar8;
      if (uVar6 < uVar10) {
        uVar6 = uVar10;
        in_R10D = aVar1;
        in_R9D = aVar2;
      }
    }
    lVar4 = lVar4 + 1;
  }
  start->field_0 = in_R10D;
  end->field_0 = in_R9D;
  return;
}

Assistant:

void ColorBlock::diameterRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);
	
	Color32 c0, c1;
	uint best_dist = 0;
	
	for(int i = 0; i < 16; i++) {
		for (int j = i+1; j < 16; j++) {
			uint dist = colorDistance(m_color[i], m_color[j]);
			if( dist > best_dist ) {
				best_dist = dist;
				c0 = m_color[i];
				c1 = m_color[j];
			}
		}
	}
	
	*start = c0;
	*end = c1;
}